

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O2

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::sphereTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,float radius,
          bool allowHitSurface)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar12;
  vec<3,_float,_(glm::qualifier)0> local_88;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  vec<3,_float,_(glm::qualifier)0> local_38;
  vec<3,_float,_(glm::qualifier)0> local_28;
  undefined1 extraout_var [60];
  
  aVar12 = center.field_2;
  auVar11._8_56_ = center._8_56_;
  auVar11._0_8_ = center._0_8_;
  local_88.field_2 = rayDir.field_2;
  auVar10._8_56_ = rayDir._8_56_;
  auVar10._0_8_ = rayDir._0_8_;
  aVar8 = raySource.field_2;
  auVar6._8_56_ = raySource._8_56_;
  auVar6._0_8_ = raySource._0_8_;
  _local_78 = auVar6._0_16_;
  local_48 = auVar11._0_16_;
  auVar9 = vsubps_avx(_local_78,local_48);
  local_28.field_2.z = aVar8.z - aVar12.z;
  local_68._0_4_ = radius;
  local_88._0_8_ = vmovlps_avx(auVar10._0_16_);
  local_28._0_8_ = vmovlps_avx(auVar9);
  fVar4 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                    (&local_28,&local_88);
  local_58 = ZEXT416((uint)(fVar4 + fVar4));
  auVar7._0_4_ = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                           (&local_28,&local_28);
  auVar7._4_60_ = extraout_var;
  auVar9 = vfnmadd231ss_fma(auVar7._0_16_,ZEXT416((uint)local_68._0_4_),
                            ZEXT416((uint)local_68._0_4_));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * -4.0)),local_58,local_58);
  fVar4 = auVar9._0_4_;
  if (fVar4 < 1e-06 || !allowHitSurface) {
    auVar9 = vsubps_avx(local_48,_local_78);
    local_38.field_2.z = aVar12.z - aVar8.z;
    local_38._0_8_ = vmovlps_avx(auVar9);
    local_58._0_4_ =
         glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                   (&local_88,&local_38);
    if (0.0 <= (float)local_58._0_4_) {
      local_58._4_4_ = extraout_XMM0_Db;
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._12_4_ = extraout_XMM0_Dd;
      local_78._0_4_ = (float)local_58._0_4_ * local_88.field_0.x + (float)local_78._0_4_;
      local_78._4_4_ = (float)local_58._0_4_ * local_88.field_1.y + (float)local_78._4_4_;
      fStack_70 = (float)local_58._0_4_ * 0.0 + fStack_70;
      fStack_6c = (float)local_58._0_4_ * 0.0 + fStack_6c;
      fVar4 = (float)local_58._0_4_ * local_88.field_2.z + aVar8.z;
      auVar9 = vsubps_avx(_local_78,local_48);
      local_38.field_2.z = fVar4 - aVar12.z;
      local_38._0_8_ = vmovlps_avx(auVar9);
      fVar5 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_38);
      uVar1 = vmovlps_avx(_local_78);
      p_Var3 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
           fVar4;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<1UL,_float,_false>._M_head_impl = fVar5 - (float)local_68._0_4_;
      goto LAB_001b5f82;
    }
  }
  else {
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    local_68 = vxorps_avx512vl(local_58,auVar2);
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar4 = auVar9._0_4_;
    }
    local_58._0_4_ = (local_68._0_4_ - fVar4) * 0.5;
    if (0.0 <= (float)local_58._0_4_) {
      auVar9._0_4_ = (float)local_58._0_4_ * local_88.field_0.x + (float)local_78._0_4_;
      auVar9._4_4_ = (float)local_58._0_4_ * local_88.field_1.y + (float)local_78._4_4_;
      auVar9._8_4_ = (float)local_58._0_4_ * 0.0 + fStack_70;
      auVar9._12_4_ = (float)local_58._0_4_ * 0.0 + fStack_6c;
      uVar1 = vmovlps_avx(auVar9);
      p_Var3 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
           (float)local_58._0_4_ * local_88.field_2.z + aVar8.z;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<1UL,_float,_false>._M_head_impl = 0.0;
LAB_001b5f82:
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<0UL,_float,_false>._M_head_impl = (float)local_58._0_4_;
      return __return_storage_ptr__;
    }
  }
  p_Var3 = &(__return_storage_ptr__->
            super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
            super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
    super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
    super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       0x7f80000000000000;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = -1.0;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::sphereTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                    glm::vec3 center, float radius,
                                                                    bool allowHitSurface) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 oc = raySource - center;
  float b = 2. * dot(oc, rayDir);
  float c = glm::dot(oc, oc) - radius * radius;
  float disc = b * b - 4 * c;
  if (disc < 1e-6 || !allowHitSurface) {
    // miss, return nearest point
    float tHit = glm::dot(rayDir, center - raySource);
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    glm::vec3 hitPoint = raySource + tHit * rayDir;
    return ret_t{tHit, glm::length(hitPoint - center) - radius, hitPoint};
  } else {
    // actual hit
    float tHit = (-b - std::sqrt(disc)) / 2.;
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    return ret_t{tHit, 0, raySource + tHit * rayDir};
  }
}